

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkDefaultCompatibility
          (CompatibilityChecker *this,Reader *value,Reader *replacement)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  char cVar7;
  long lVar8;
  short sVar9;
  undefined2 uVar10;
  int iVar11;
  short sVar12;
  int iVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  double dVar17;
  
  uVar1 = (value->_reader).dataSize;
  if (uVar1 < 0x10) {
    sVar9 = 0;
  }
  else {
    sVar9 = *(value->_reader).data;
  }
  uVar2 = (replacement->_reader).dataSize;
  if (uVar2 < 0x10) {
    sVar12 = 0;
  }
  else {
    sVar12 = *(replacement->_reader).data;
  }
  if (sVar9 == sVar12) {
    if (uVar1 < 0x10) {
      uVar10 = 0;
    }
    else {
      uVar10 = *(value->_reader).data;
    }
    switch(uVar10) {
    case 1:
      if (uVar1 < 0x11) {
        bVar6 = 0;
      }
      else {
        bVar6 = *(byte *)((long)(value->_reader).data + 2) & 1;
      }
      if (uVar2 < 0x11) {
        bVar4 = 0;
      }
      else {
        bVar4 = *(byte *)((long)(replacement->_reader).data + 2) & 1;
      }
      if (bVar6 != bVar4) {
        checkDefaultCompatibility(this);
      }
      break;
    case 2:
      if (uVar1 < 0x18) {
        cVar7 = '\0';
      }
      else {
        cVar7 = *(char *)((long)(value->_reader).data + 2);
      }
      if (uVar2 < 0x18) {
        cVar3 = '\0';
      }
      else {
        cVar3 = *(char *)((long)(replacement->_reader).data + 2);
      }
      if (cVar7 != cVar3) {
        checkDefaultCompatibility(this);
      }
      break;
    case 3:
      if (uVar1 < 0x20) {
        sVar9 = 0;
      }
      else {
        sVar9 = *(short *)((long)(value->_reader).data + 2);
      }
      if (uVar2 < 0x20) {
        sVar12 = 0;
      }
      else {
        sVar12 = *(short *)((long)(replacement->_reader).data + 2);
      }
      if (sVar9 != sVar12) {
        checkDefaultCompatibility(this);
      }
      break;
    case 4:
      iVar11 = 0;
      iVar13 = 0;
      if (0x3f < uVar1) {
        iVar13 = *(int *)((long)(value->_reader).data + 4);
      }
      if (0x3f < uVar2) {
        iVar11 = *(int *)((long)(replacement->_reader).data + 4);
      }
      if (iVar13 != iVar11) {
        checkDefaultCompatibility(this);
      }
      break;
    case 5:
      if (uVar1 < 0x80) {
        lVar8 = 0;
      }
      else {
        lVar8 = *(long *)((long)(value->_reader).data + 8);
      }
      if (uVar2 < 0x80) {
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)((long)(replacement->_reader).data + 8);
      }
      if (lVar8 != lVar5) {
        checkDefaultCompatibility(this);
      }
      break;
    case 6:
      if (uVar1 < 0x18) {
        cVar7 = '\0';
      }
      else {
        cVar7 = *(char *)((long)(value->_reader).data + 2);
      }
      if (uVar2 < 0x18) {
        cVar3 = '\0';
      }
      else {
        cVar3 = *(char *)((long)(replacement->_reader).data + 2);
      }
      if (cVar7 != cVar3) {
        checkDefaultCompatibility(this);
      }
      break;
    case 7:
      if (uVar1 < 0x20) {
        sVar9 = 0;
      }
      else {
        sVar9 = *(short *)((long)(value->_reader).data + 2);
      }
      if (uVar2 < 0x20) {
        sVar12 = 0;
      }
      else {
        sVar12 = *(short *)((long)(replacement->_reader).data + 2);
      }
      if (sVar9 != sVar12) {
        checkDefaultCompatibility(this);
      }
      break;
    case 8:
      iVar11 = 0;
      iVar13 = 0;
      if (0x3f < uVar1) {
        iVar13 = *(int *)((long)(value->_reader).data + 4);
      }
      if (0x3f < uVar2) {
        iVar11 = *(int *)((long)(replacement->_reader).data + 4);
      }
      if (iVar13 != iVar11) {
        checkDefaultCompatibility(this);
      }
      break;
    case 9:
      if (uVar1 < 0x80) {
        lVar8 = 0;
      }
      else {
        lVar8 = *(long *)((long)(value->_reader).data + 8);
      }
      if (uVar2 < 0x80) {
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)((long)(replacement->_reader).data + 8);
      }
      if (lVar8 != lVar5) {
        checkDefaultCompatibility(this);
      }
      break;
    case 10:
      fVar14 = 0.0;
      fVar16 = 0.0;
      if (0x3f < uVar1) {
        fVar16 = *(float *)((long)(value->_reader).data + 4);
      }
      if (0x3f < uVar2) {
        fVar14 = *(float *)((long)(replacement->_reader).data + 4);
      }
      if ((fVar16 != fVar14) || (NAN(fVar16) || NAN(fVar14))) {
        checkDefaultCompatibility(this);
      }
      break;
    case 0xb:
      dVar15 = 0.0;
      dVar17 = 0.0;
      if (0x7f < uVar1) {
        dVar17 = *(double *)((long)(value->_reader).data + 8);
      }
      if (0x7f < uVar2) {
        dVar15 = *(double *)((long)(replacement->_reader).data + 8);
      }
      if ((dVar17 != dVar15) || (NAN(dVar17) || NAN(dVar15))) {
        checkDefaultCompatibility(this);
      }
      break;
    case 0xf:
      if (uVar1 < 0x20) {
        sVar9 = 0;
      }
      else {
        sVar9 = *(short *)((long)(value->_reader).data + 2);
      }
      if (uVar2 < 0x20) {
        sVar12 = 0;
      }
      else {
        sVar12 = *(short *)((long)(replacement->_reader).data + 2);
      }
      if (sVar9 != sVar12) {
        checkDefaultCompatibility(this);
      }
    }
  }
  else {
    checkDefaultCompatibility(this);
  }
  return;
}

Assistant:

inline T StructReader::getDataField(StructDataOffset offset) const {
  if ((offset + ONE * ELEMENTS) * capnp::bitsPerElement<T>() <= dataSize) {
    return reinterpret_cast<const WireValue<T>*>(data)[unbound(offset / ELEMENTS)].get();
  } else {
    return static_cast<T>(0);
  }
}